

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleImageTests.cpp
# Opt level: O0

void vkt::pipeline::anon_unknown_0::SampledImage::initPrograms
               (SourceCollections *programCollection,CaseDef *caseDef)

{
  CaseDef *pCVar1;
  VkFormat format;
  char *pcVar2;
  ostream *poVar3;
  ProgramSources *pPVar4;
  bool isUint_00;
  undefined1 in_R9B;
  char *local_548;
  string local_4a8;
  ShaderSource local_488;
  allocator<char> local_459;
  string local_458;
  ostringstream local_438 [8];
  ostringstream src_1;
  undefined1 local_2c0 [8];
  string samplerTypeStr;
  string refPrimitiveColor;
  string refClearColor;
  string local_258 [8];
  string texelFormatStr;
  bool isSint;
  bool isUint;
  undefined1 local_228 [4];
  int numComponents;
  ShaderSource local_208;
  allocator<char> local_1d9;
  string local_1d8;
  ostringstream local_1a8 [8];
  ostringstream src;
  CaseDef local_2c;
  CaseDef *local_18;
  CaseDef *caseDef_local;
  SourceCollections *programCollection_local;
  
  local_18 = caseDef;
  caseDef_local = (CaseDef *)programCollection;
  CaseDef::CaseDef(&local_2c,caseDef);
  addSimpleVertexAndFragmentPrograms(programCollection,&local_2c);
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  pcVar2 = glu::getGLSLVersionDeclaration(GLSL_VERSION_450);
  poVar3 = std::operator<<((ostream *)local_1a8,pcVar2);
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"layout(location = 0) in  vec4  in_position;\n");
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"out gl_PerVertex {\n");
  poVar3 = std::operator<<(poVar3,"    vec4 gl_Position;\n");
  poVar3 = std::operator<<(poVar3,"};\n");
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"void main(void)\n");
  poVar3 = std::operator<<(poVar3,"{\n");
  poVar3 = std::operator<<(poVar3,"    gl_Position = in_position;\n");
  std::operator<<(poVar3,"}\n");
  pCVar1 = caseDef_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,"sample_vert",&local_1d9);
  pPVar4 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     ((ProgramCollection<glu::ProgramSources> *)pCVar1,&local_1d8);
  std::__cxx11::ostringstream::str();
  glu::VertexSource::VertexSource((VertexSource *)&local_208,(string *)local_228);
  glu::ProgramSources::operator<<(pPVar4,&local_208);
  glu::VertexSource::~VertexSource((VertexSource *)&local_208);
  std::__cxx11::string::~string((string *)local_228);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::allocator<char>::~allocator(&local_1d9);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  register0x00000000 = ::vk::mapVkFormat(caseDef->colorFormat);
  format = tcu::getNumUsedChannels(texelFormatStr.field_2._12_4_);
  texelFormatStr.field_2._M_local_buf[0xb] = ::vk::isUintFormat(caseDef->colorFormat);
  texelFormatStr.field_2._M_local_buf[10] = ::vk::isIntFormat(caseDef->colorFormat);
  if ((texelFormatStr.field_2._M_local_buf[0xb] & 1U) == 0) {
    local_548 = "vec4";
    if ((bool)texelFormatStr.field_2._M_local_buf[10]) {
      local_548 = "ivec4";
    }
  }
  else {
    local_548 = "uvec4";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_258,local_548,(allocator<char> *)(refClearColor.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(refClearColor.field_2._M_local_buf + 0xf));
  isUint_00 = (bool)(texelFormatStr.field_2._M_local_buf[10] & 1);
  pipeline::(anonymous_namespace)::getReferenceClearColorStr_abi_cxx11_
            ((string *)((long)&refPrimitiveColor.field_2 + 8),
             (_anonymous_namespace_ *)(ulong)caseDef->colorFormat,format,
             (byte)texelFormatStr.field_2._M_local_buf[0xb] & 1,isUint_00,(bool)in_R9B);
  pipeline::(anonymous_namespace)::getReferencePrimitiveColorStr_abi_cxx11_
            ((string *)((long)&samplerTypeStr.field_2 + 8),(_anonymous_namespace_ *)(ulong)format,
             (byte)texelFormatStr.field_2._M_local_buf[0xb] & 1,
             (bool)(texelFormatStr.field_2._M_local_buf[10] & 1),isUint_00);
  pipeline::(anonymous_namespace)::getSamplerTypeStr_abi_cxx11_
            ((string *)local_2c0,(_anonymous_namespace_ *)(ulong)(uint)caseDef->numLayers,
             (byte)texelFormatStr.field_2._M_local_buf[0xb] & 1,
             (bool)(texelFormatStr.field_2._M_local_buf[10] & 1),isUint_00);
  std::__cxx11::ostringstream::ostringstream(local_438);
  pcVar2 = glu::getGLSLVersionDeclaration(GLSL_VERSION_450);
  poVar3 = std::operator<<((ostream *)local_438,pcVar2);
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"layout(location = 0) out int o_status;\n");
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"layout(set = 0, binding = 0) uniform ");
  poVar3 = std::operator<<(poVar3,(string *)local_2c0);
  poVar3 = std::operator<<(poVar3," colorTexture;\n");
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"void main(void)\n");
  poVar3 = std::operator<<(poVar3,"{\n");
  poVar3 = std::operator<<(poVar3,"    int checksum = 0;\n");
  std::operator<<(poVar3,"\n");
  if (caseDef->numLayers == 1) {
    poVar3 = std::operator<<((ostream *)local_438,"    for (int sampleNdx = 0; sampleNdx < ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,caseDef->numSamples);
    poVar3 = std::operator<<(poVar3,"; ++sampleNdx) {\n");
    poVar3 = std::operator<<(poVar3,"        ");
    poVar3 = std::operator<<(poVar3,local_258);
    poVar3 = std::operator<<(poVar3,
                             " color = texelFetch(colorTexture, ivec2(gl_FragCoord.xy), sampleNdx);\n"
                            );
    poVar3 = std::operator<<(poVar3,"        if (color == ");
    poVar3 = std::operator<<(poVar3,(string *)(refPrimitiveColor.field_2._M_local_buf + 8));
    poVar3 = std::operator<<(poVar3," || color == ");
    poVar3 = std::operator<<(poVar3,(string *)(samplerTypeStr.field_2._M_local_buf + 8));
    poVar3 = std::operator<<(poVar3,")\n");
    poVar3 = std::operator<<(poVar3,"            ++checksum;\n");
    std::operator<<(poVar3,"    }\n");
  }
  else {
    poVar3 = std::operator<<((ostream *)local_438,"    for (int layerNdx = 0; layerNdx < ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,caseDef->numLayers);
    poVar3 = std::operator<<(poVar3,"; ++layerNdx)\n");
    poVar3 = std::operator<<(poVar3,"    for (int sampleNdx = 0; sampleNdx < ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,caseDef->numSamples);
    poVar3 = std::operator<<(poVar3,"; ++sampleNdx) {\n");
    poVar3 = std::operator<<(poVar3,"        ");
    poVar3 = std::operator<<(poVar3,local_258);
    poVar3 = std::operator<<(poVar3,
                             " color = texelFetch(colorTexture, ivec3(gl_FragCoord.xy, layerNdx), sampleNdx);\n"
                            );
    poVar3 = std::operator<<(poVar3,"        if (color == ");
    poVar3 = std::operator<<(poVar3,(string *)(refPrimitiveColor.field_2._M_local_buf + 8));
    poVar3 = std::operator<<(poVar3," || color == ");
    poVar3 = std::operator<<(poVar3,(string *)(samplerTypeStr.field_2._M_local_buf + 8));
    poVar3 = std::operator<<(poVar3,")\n");
    poVar3 = std::operator<<(poVar3,"            ++checksum;\n");
    std::operator<<(poVar3,"    }\n");
  }
  poVar3 = std::operator<<((ostream *)local_438,"\n");
  poVar3 = std::operator<<(poVar3,"    o_status = checksum;\n");
  std::operator<<(poVar3,"}\n");
  pCVar1 = caseDef_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_458,"sample_frag",&local_459);
  pPVar4 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     ((ProgramCollection<glu::ProgramSources> *)pCVar1,&local_458);
  std::__cxx11::ostringstream::str();
  glu::FragmentSource::FragmentSource((FragmentSource *)&local_488,&local_4a8);
  glu::ProgramSources::operator<<(pPVar4,&local_488);
  glu::FragmentSource::~FragmentSource((FragmentSource *)&local_488);
  std::__cxx11::string::~string((string *)&local_4a8);
  std::__cxx11::string::~string((string *)&local_458);
  std::allocator<char>::~allocator(&local_459);
  std::__cxx11::ostringstream::~ostringstream(local_438);
  std::__cxx11::string::~string((string *)local_2c0);
  std::__cxx11::string::~string((string *)(samplerTypeStr.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(refPrimitiveColor.field_2._M_local_buf + 8));
  std::__cxx11::string::~string(local_258);
  return;
}

Assistant:

void initPrograms (SourceCollections& programCollection, const CaseDef caseDef)
{
	// Pass 1: Render to texture

	addSimpleVertexAndFragmentPrograms(programCollection, caseDef);

	// Pass 2: Sample texture

	// Vertex shader
	{
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_450) << "\n"
			<< "\n"
			<< "layout(location = 0) in  vec4  in_position;\n"
			<< "\n"
			<< "out gl_PerVertex {\n"
			<< "    vec4 gl_Position;\n"
			<< "};\n"
			<< "\n"
			<< "void main(void)\n"
			<< "{\n"
			<< "    gl_Position = in_position;\n"
			<< "}\n";

		programCollection.glslSources.add("sample_vert") << glu::VertexSource(src.str());
	}

	// Fragment shader
	{
		const int			numComponents		= tcu::getNumUsedChannels(mapVkFormat(caseDef.colorFormat).order);
		const bool			isUint				= isUintFormat(caseDef.colorFormat);
		const bool			isSint				= isIntFormat(caseDef.colorFormat);
		const std::string	texelFormatStr		= (isUint ? "uvec4" : isSint ? "ivec4" : "vec4");
		const std::string	refClearColor		= getReferenceClearColorStr(caseDef.colorFormat, numComponents, isUint, isSint);
		const std::string	refPrimitiveColor	= getReferencePrimitiveColorStr(numComponents, isUint, isSint);
		const std::string	samplerTypeStr		= getSamplerTypeStr(caseDef.numLayers, isUint, isSint);

		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_450) << "\n"
			<< "\n"
			<< "layout(location = 0) out int o_status;\n"
			<< "\n"
			<< "layout(set = 0, binding = 0) uniform " << samplerTypeStr << " colorTexture;\n"
			<< "\n"
			<< "void main(void)\n"
			<< "{\n"
			<< "    int checksum = 0;\n"
			<< "\n";

		if (caseDef.numLayers == 1)
			src << "    for (int sampleNdx = 0; sampleNdx < " << caseDef.numSamples << "; ++sampleNdx) {\n"
				<< "        " << texelFormatStr << " color = texelFetch(colorTexture, ivec2(gl_FragCoord.xy), sampleNdx);\n"
				<< "        if (color == " << refClearColor << " || color == " << refPrimitiveColor << ")\n"
				<< "            ++checksum;\n"
				<< "    }\n";
		else
			src << "    for (int layerNdx = 0; layerNdx < " << caseDef.numLayers << "; ++layerNdx)\n"
				<< "    for (int sampleNdx = 0; sampleNdx < " << caseDef.numSamples << "; ++sampleNdx) {\n"
				<< "        " << texelFormatStr << " color = texelFetch(colorTexture, ivec3(gl_FragCoord.xy, layerNdx), sampleNdx);\n"
				<< "        if (color == " << refClearColor << " || color == " << refPrimitiveColor << ")\n"
				<< "            ++checksum;\n"
				<< "    }\n";

		src << "\n"
			<< "    o_status = checksum;\n"
			<< "}\n";

		programCollection.glslSources.add("sample_frag") << glu::FragmentSource(src.str());
	}
}